

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::swap
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,
          SmallVectorBase<slang::IntervalMapDetails::NodeRef> *rhs)

{
  pointer pNVar1;
  size_type sVar2;
  pointer pNVar3;
  uintptr_t uVar4;
  ulong uVar5;
  NodeRef *__tmp;
  size_type i;
  ulong uVar6;
  ulong uVar7;
  
  if (this != rhs) {
    pNVar1 = this->data_;
    if ((pNVar1 == (pointer)this->firstElement) || (rhs->data_ == (pointer)rhs->firstElement)) {
      reserve(this,rhs->len);
      reserve(rhs,this->len);
      pNVar1 = this->data_;
      pNVar3 = rhs->data_;
      uVar7 = this->len;
      if (rhs->len < this->len) {
        uVar7 = rhs->len;
      }
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        uVar4 = pNVar1[uVar6].pip.value;
        pNVar1[uVar6].pip.value = pNVar3[uVar6].pip.value;
        pNVar3[uVar6].pip.value = uVar4;
      }
      uVar6 = this->len;
      uVar5 = rhs->len;
      if (uVar5 < uVar6) {
        std::ranges::__uninitialized_copy_fn::
        operator()<slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*>
                  ((__uninitialized_copy_fn *)&std::ranges::uninitialized_copy,pNVar1 + uVar7,
                   pNVar1 + uVar6,pNVar3 + uVar5,pNVar3 + uVar5 + (uVar6 - uVar7));
        rhs->len = this->len;
        this->len = uVar7;
      }
      else if (uVar6 < uVar5) {
        std::ranges::__uninitialized_copy_fn::
        operator()<slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*>
                  ((__uninitialized_copy_fn *)&std::ranges::uninitialized_copy,pNVar3 + uVar7,
                   pNVar3 + uVar5,pNVar1 + uVar6,pNVar1 + uVar6 + (uVar5 - uVar7));
        this->len = rhs->len;
        rhs->len = uVar7;
      }
    }
    else {
      this->data_ = rhs->data_;
      rhs->data_ = pNVar1;
      sVar2 = this->len;
      this->len = rhs->len;
      rhs->len = sVar2;
      sVar2 = this->cap;
      this->cap = rhs->cap;
      rhs->cap = sVar2;
    }
  }
  return;
}

Assistant:

void SmallVectorBase<T>::swap(SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return;

    // We can only do a true swap if neither vector is small.
    if (!isSmall() && !rhs.isSmall()) {
        std::swap(data_, rhs.data_);
        std::swap(len, rhs.len);
        std::swap(cap, rhs.cap);
        return;
    }

    // Make sure each container has enough space for each other's elements.
    reserve(rhs.size());
    rhs.reserve(size());

    // Swap the shared elements.
    size_type numShared = std::min(size(), rhs.size());
    for (size_type i = 0; i < numShared; i++)
        std::swap((*this)[i], rhs[i]);

    // Copy over the extra elements from whichever side is larger.
    if (size() > rhs.size()) {
        std::ranges::uninitialized_copy(begin() + numShared, end(), rhs.end(),
                                        rhs.end() + size() - numShared);
        rhs.len = len;

        std::ranges::destroy(begin() + numShared, end());
        len = numShared;
    }
    else if (rhs.size() > size()) {
        std::ranges::uninitialized_copy(rhs.begin() + numShared, rhs.end(), end(),
                                        end() + rhs.size() - numShared);
        len = rhs.len;

        std::ranges::destroy(rhs.begin() + numShared, rhs.end());
        rhs.len = numShared;
    }
}